

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_data.cpp
# Opt level: O0

Euler_Data * Get_Euler(void)

{
  double dVar1;
  bool bVar2;
  Euler_Data *in_RDI;
  int local_2c;
  duration<long,_std::ratio<1L,_1000L>_> local_28 [2];
  undefined1 local_18 [8];
  unique_lock<std::timed_mutex> euler_lock;
  
  std::unique_lock<std::timed_mutex>::unique_lock
            ((unique_lock<std::timed_mutex> *)local_18,&Euler_Mutex);
  local_2c = 5;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_28,&local_2c);
  bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    ((unique_lock<std::timed_mutex> *)local_18,local_28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    in_RDI->yaw = Euler.yaw;
    dVar1 = Euler.pitch;
    in_RDI->roll = Euler.roll;
    in_RDI->pitch = dVar1;
    std::unique_lock<std::timed_mutex>::unlock((unique_lock<std::timed_mutex> *)local_18);
  }
  else {
    Euler_Data::Euler_Data(in_RDI);
  }
  std::unique_lock<std::timed_mutex>::~unique_lock((unique_lock<std::timed_mutex> *)local_18);
  return in_RDI;
}

Assistant:

Euler_Data Get_Euler()
{
    unique_lock<timed_mutex> euler_lock(Euler_Mutex, defer_lock);

    if (!euler_lock.try_lock_for(chrono::milliseconds(5)))
        return Euler_Data();

    Euler_Data ret = Euler;

    euler_lock.unlock();

    return ret;
}